

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

int LWZReadByte(gdIOCtx *fd,LZW_STATIC_DATA *sd,char flag,int input_code_size,int *ZeroDataBlockP)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uchar buf [260];
  uchar local_138 [264];
  
  if (flag == '\0') {
    if (sd->fresh == 0) {
      piVar4 = sd->sp;
      piVar1 = sd->stack;
      if (piVar1 < piVar4) {
        sd->sp = piVar4 + -1;
        iVar2 = piVar4[-1];
      }
      else {
        do {
          uVar7 = GetCode(fd,&sd->scd,sd->code_size,0,ZeroDataBlockP);
          if ((int)uVar7 < 0) {
            return uVar7;
          }
          uVar3 = sd->clear_code;
          if (uVar7 == uVar3) {
            if ((int)uVar3 < 1) {
              uVar5 = 0;
            }
            else {
              uVar5 = 0;
              do {
                sd->table[0][uVar5] = 0;
                sd->table[1][uVar5] = (int)uVar5;
                uVar5 = uVar5 + 1;
              } while (uVar3 != uVar5);
            }
            if ((uint)uVar5 < 0x1000) {
              lVar6 = (uVar5 & 0xffffffff) - 0x1000;
              do {
                sd->stack[lVar6] = 0;
                sd->table[1][lVar6] = 0;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0);
            }
            iVar2 = sd->set_code_size + 1;
            sd->code_size = iVar2;
            sd->max_code_size = uVar3 * 2;
            sd->max_code = uVar3 + 2;
            sd->sp = piVar1;
            iVar2 = GetCode(fd,&sd->scd,iVar2,0,ZeroDataBlockP);
            sd->oldcode = iVar2;
            sd->firstcode = iVar2;
            return iVar2;
          }
          if (uVar7 == sd->end_code) {
            if (*ZeroDataBlockP != 0) {
              return -2;
            }
            do {
              iVar2 = GetDataBlock(fd,local_138,ZeroDataBlockP);
            } while (0 < iVar2);
            if (iVar2 != 0) {
              return -2;
            }
          }
          piVar4 = sd->sp;
          if (piVar4 == (int *)&sd->field_0x10024) {
            return -1;
          }
          uVar3 = uVar7;
          if (sd->max_code <= (int)uVar7) {
            sd->sp = piVar4 + 1;
            *piVar4 = sd->firstcode;
            uVar3 = sd->oldcode;
          }
          if (sd->clear_code <= (int)uVar3) {
            piVar4 = sd->sp;
            do {
              if (piVar4 == (int *)&sd->field_0x10024) {
                return -1;
              }
              iVar2 = sd->table[1][(int)uVar3];
              sd->sp = piVar4 + 1;
              *piVar4 = iVar2;
              uVar3 = sd->table[0][(int)uVar3];
              piVar4 = piVar4 + 1;
            } while (sd->clear_code <= (int)uVar3);
          }
          iVar2 = sd->table[1][(int)uVar3];
          sd->firstcode = iVar2;
          piVar4 = sd->sp;
          sd->sp = piVar4 + 1;
          *piVar4 = iVar2;
          lVar6 = (long)sd->max_code;
          if (lVar6 < 0x1000) {
            sd->table[0][lVar6] = sd->oldcode;
            sd->table[1][lVar6] = sd->firstcode;
            iVar2 = sd->max_code_size;
            iVar8 = sd->max_code + 1;
            sd->max_code = iVar8;
            if (iVar2 < 0x1000 && iVar2 <= iVar8) {
              sd->max_code_size = iVar2 * 2;
              sd->code_size = sd->code_size + 1;
            }
          }
          sd->oldcode = uVar7;
        } while (piVar4 + 1 <= piVar1);
        sd->sp = piVar4;
        iVar2 = *piVar4;
      }
    }
    else {
      sd->fresh = 0;
      do {
        iVar2 = GetCode(fd,&sd->scd,sd->code_size,0,ZeroDataBlockP);
        sd->oldcode = iVar2;
        sd->firstcode = iVar2;
      } while (iVar2 == sd->clear_code);
    }
  }
  else {
    sd->set_code_size = input_code_size;
    sd->code_size = input_code_size + 1;
    uVar7 = 1 << ((byte)input_code_size & 0x1f);
    sd->clear_code = uVar7;
    sd->end_code = uVar7 + 1;
    sd->max_code_size = 2 << ((byte)input_code_size & 0x1f);
    sd->max_code = uVar7 + 2;
    (sd->scd).curbit = 0;
    (sd->scd).lastbit = 0;
    (sd->scd).done = 0;
    (sd->scd).last_byte = 0;
    sd->fresh = 1;
    uVar5 = 0;
    if (input_code_size != 0x1f) {
      uVar3 = 1;
      if (1 < (int)uVar7) {
        uVar3 = uVar7;
      }
      uVar5 = 0;
      do {
        sd->table[0][uVar5] = 0;
        sd->table[1][uVar5] = (int)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    if ((uint)uVar5 < 0x1000) {
      uVar5 = uVar5 & 0xffffffff;
      do {
        sd->table[1][0] = 0;
        sd->table[0][uVar5] = 0;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x1000);
    }
    sd->sp = sd->stack;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
LWZReadByte(gdIOCtx *fd, LZW_STATIC_DATA *sd, char flag, int input_code_size, int *ZeroDataBlockP)
{
	int rv;

	rv = LWZReadByte_(fd, sd, flag, input_code_size, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[LWZReadByte(,%d,%d) returning %d]\n",flag,input_code_size,rv);
	}

	return rv;
}